

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O0

void jpeg_fdct_float(float *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte *pbVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int ctr;
  JSAMPROW elemptr;
  float *dataptr;
  float z13;
  float z11;
  float z5;
  float z4;
  float z3;
  float z2;
  float z1;
  float tmp13;
  float tmp12;
  float tmp11;
  float tmp10;
  float tmp7;
  float tmp6;
  float tmp5;
  float tmp4;
  float tmp3;
  float tmp2;
  float tmp1;
  float tmp0;
  JDIMENSION start_col_local;
  JSAMPARRAY sample_data_local;
  float *data_local;
  
  dataptr = data;
  for (ctr = 0; ctr < 8; ctr = ctr + 1) {
    pbVar11 = sample_data[ctr] + start_col;
    fVar12 = (float)(int)((uint)*pbVar11 - (uint)pbVar11[7]);
    bVar1 = pbVar11[1];
    bVar2 = pbVar11[6];
    bVar3 = pbVar11[1];
    bVar4 = pbVar11[6];
    bVar5 = pbVar11[2];
    bVar6 = pbVar11[5];
    bVar7 = pbVar11[2];
    bVar8 = pbVar11[5];
    bVar9 = pbVar11[3];
    bVar10 = pbVar11[4];
    fVar13 = (float)((uint)*pbVar11 + (uint)pbVar11[7]) +
             (float)((uint)pbVar11[3] + (uint)pbVar11[4]);
    fVar14 = (float)((uint)*pbVar11 + (uint)pbVar11[7]) -
             (float)((uint)pbVar11[3] + (uint)pbVar11[4]);
    fVar15 = (float)((uint)bVar1 + (uint)bVar2) + (float)((uint)bVar5 + (uint)bVar6);
    *dataptr = (fVar13 + fVar15) - 1024.0;
    dataptr[4] = fVar13 - fVar15;
    fVar13 = (((float)((uint)bVar1 + (uint)bVar2) - (float)((uint)bVar5 + (uint)bVar6)) + fVar14) *
             0.70710677;
    dataptr[2] = fVar14 + fVar13;
    dataptr[6] = fVar14 - fVar13;
    fVar13 = (float)(int)((uint)bVar9 - (uint)bVar10) + (float)(int)((uint)bVar7 - (uint)bVar8);
    fVar14 = (float)(int)((uint)bVar3 - (uint)bVar4) + fVar12;
    fVar15 = (fVar13 - fVar14) * 0.38268343;
    fVar13 = fVar13 * 0.5411961 + fVar15;
    fVar15 = fVar14 * 1.306563 + fVar15;
    fVar14 = ((float)(int)((uint)bVar7 - (uint)bVar8) + (float)(int)((uint)bVar3 - (uint)bVar4)) *
             0.70710677;
    fVar16 = fVar12 + fVar14;
    fVar12 = fVar12 - fVar14;
    dataptr[5] = fVar12 + fVar13;
    dataptr[3] = fVar12 - fVar13;
    dataptr[1] = fVar16 + fVar15;
    dataptr[7] = fVar16 - fVar15;
    dataptr = dataptr + 8;
  }
  dataptr = data;
  for (ctr = 7; -1 < ctr; ctr = ctr + -1) {
    fVar17 = *dataptr - dataptr[0x38];
    fVar13 = dataptr[0x30];
    fVar14 = dataptr[0x10];
    fVar15 = dataptr[0x20];
    fVar16 = *dataptr + dataptr[0x38] + dataptr[0x18] + dataptr[0x20];
    fVar12 = (*dataptr + dataptr[0x38]) - (dataptr[0x18] + dataptr[0x20]);
    fVar18 = dataptr[8] + dataptr[0x30] + dataptr[0x10] + dataptr[0x28];
    *dataptr = fVar16 + fVar18;
    dataptr[0x20] = fVar16 - fVar18;
    fVar16 = (((dataptr[8] + dataptr[0x30]) - (dataptr[0x10] + dataptr[0x28])) + fVar12) *
             0.70710677;
    dataptr[0x10] = fVar12 + fVar16;
    dataptr[0x30] = fVar12 - fVar16;
    fVar15 = (dataptr[0x18] - fVar15) + (fVar14 - dataptr[0x28]);
    fVar16 = (dataptr[8] - fVar13) + fVar17;
    fVar12 = (fVar15 - fVar16) * 0.38268343;
    fVar15 = fVar15 * 0.5411961 + fVar12;
    fVar12 = fVar16 * 1.306563 + fVar12;
    fVar13 = ((fVar14 - dataptr[0x28]) + (dataptr[8] - fVar13)) * 0.70710677;
    fVar14 = fVar17 + fVar13;
    fVar17 = fVar17 - fVar13;
    dataptr[0x28] = fVar17 + fVar15;
    dataptr[0x18] = fVar17 - fVar15;
    dataptr[8] = fVar14 + fVar12;
    dataptr[0x38] = fVar14 - fVar12;
    dataptr = dataptr + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float (FAST_FLOAT * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  JSAMPROW elemptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]));
    tmp7 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]));
    tmp1 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]));
    tmp6 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]));
    tmp2 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]));
    tmp5 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]));
    tmp3 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]));
    tmp4 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]));

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}